

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItemIteratorPrivate::ensureValidIterator
          (QTreeWidgetItemIteratorPrivate *this,QTreeWidgetItem *itemToBeRemoved)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QTreeWidgetItemIterator *this_00;
  QTreeWidgetItem *pQVar5;
  QTreeWidgetItem *pQVar6;
  QTreeWidgetItem *in_RSI;
  QTreeWidgetItemIteratorPrivate *in_RDI;
  long in_FS_OFFSET;
  int indexOfNextItem;
  int indexOfItemToBeRemoved;
  QTreeWidget *tw;
  QTreeWidgetItem *par;
  QTreeWidgetItem *parent;
  QTreeWidgetItem *nextItem;
  QTreeWidgetItemIterator *q;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QTreeWidgetItem *in_stack_ffffffffffffffa0;
  QTreeWidgetItemIterator *in_stack_ffffffffffffffa8;
  QTreeWidgetItem *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  if (this_00->current != (QTreeWidgetItem *)0x0) {
    local_50 = this_00->current;
    pQVar5 = QTreeWidgetItem::parent(local_50);
    pQVar6 = QTreeWidgetItem::parent(in_RSI);
    if (pQVar5 != pQVar6) {
      while (pQVar6 = QTreeWidgetItem::parent(local_50),
            pQVar6 != (QTreeWidgetItem *)0x0 && local_50 != in_RSI) {
        local_50 = QTreeWidgetItem::parent(local_50);
      }
    }
    pQVar6 = local_50;
    if (local_50 == in_RSI) {
      pQVar6 = (QTreeWidgetItem *)0x0;
      for (; local_50 != (QTreeWidgetItem *)0x0 && pQVar6 == (QTreeWidgetItem *)0x0;
          local_50 = QTreeWidgetItem::parent(local_50)) {
        pQVar6 = nextSibling(in_RDI,pQVar5);
      }
      if (pQVar6 == (QTreeWidgetItem *)0x0) {
        this_00->current = (QTreeWidgetItem *)0x0;
        QList<int>::clear((QList<int> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        goto LAB_009331b8;
      }
      QTreeWidgetItemIterator::QTreeWidgetItemIterator
                (this_00,pQVar6,
                 (QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>)
                 SUB84((ulong)in_RSI >> 0x20,0));
      QTreeWidgetItemIterator::operator=
                ((QTreeWidgetItemIterator *)in_RDI,(QTreeWidgetItemIterator *)pQVar5);
      QTreeWidgetItemIterator::~QTreeWidgetItemIterator
                ((QTreeWidgetItemIterator *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      bVar2 = QTreeWidgetItemIterator::matchesFlags
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (!bVar2) {
        QTreeWidgetItemIterator::operator++
                  ((QTreeWidgetItemIterator *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      }
    }
    pQVar5 = QTreeWidgetItem::parent(pQVar6);
    pQVar6 = QTreeWidgetItem::parent(in_RSI);
    if (pQVar5 == pQVar6) {
      pQVar6 = QTreeWidgetItem::parent(in_RSI);
      QTreeWidgetItem::treeWidget(in_RSI);
      if (pQVar6 == (QTreeWidgetItem *)0x0) {
        iVar3 = QTreeWidget::indexOfTopLevelItem
                          ((QTreeWidget *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pQVar5);
      }
      else {
        iVar3 = QTreeWidgetItem::indexOfChild
                          ((QTreeWidgetItem *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pQVar5);
      }
      if (pQVar6 == (QTreeWidgetItem *)0x0) {
        iVar4 = QTreeWidget::indexOfTopLevelItem
                          ((QTreeWidget *)CONCAT44(iVar3,in_stack_ffffffffffffff70),pQVar5);
      }
      else {
        iVar4 = QTreeWidgetItem::indexOfChild
                          ((QTreeWidgetItem *)CONCAT44(iVar3,in_stack_ffffffffffffff70),pQVar5);
      }
      if (iVar3 <= iVar4) {
        in_RDI->m_currentIndex = in_RDI->m_currentIndex + -1;
      }
    }
  }
LAB_009331b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItemIteratorPrivate::ensureValidIterator(const QTreeWidgetItem *itemToBeRemoved)
{
    Q_Q(QTreeWidgetItemIterator);
    Q_ASSERT(itemToBeRemoved);

    if (!q->current) return;
    QTreeWidgetItem *nextItem = q->current;

    // Do not walk to the ancestor to find the other item if they have the same parent.
    if (nextItem->parent() != itemToBeRemoved->parent()) {
        while (nextItem->parent() && nextItem != itemToBeRemoved) {
            nextItem = nextItem->parent();
        }
    }
    // If the item to be removed is an ancestor of the current iterator item,
    // we need to adjust the iterator.
    if (nextItem == itemToBeRemoved) {
        QTreeWidgetItem *parent = nextItem;
        nextItem = nullptr;
        while (parent && !nextItem) {
            nextItem = nextSibling(parent);
            parent = parent->parent();
        }
        if (nextItem) {
            // Ooooh... Set the iterator to the next valid item
            *q = QTreeWidgetItemIterator(nextItem, q->flags);
            if (!(q->matchesFlags(nextItem))) ++(*q);
        } else {
            // set it to null.
            q->current = nullptr;
            m_parentIndex.clear();
            return;
        }
    }
    if (nextItem->parent() == itemToBeRemoved->parent()) {
        // They have the same parent, i.e. we have to adjust the m_currentIndex member of the iterator
        // if the deleted item is to the left of the nextItem.

        QTreeWidgetItem *par = itemToBeRemoved->parent();   // We know they both have the same parent.
        QTreeWidget *tw = itemToBeRemoved->treeWidget();    // ..and widget
        int indexOfItemToBeRemoved = par ? par->indexOfChild(const_cast<QTreeWidgetItem *>(itemToBeRemoved))
            : tw->indexOfTopLevelItem(const_cast<QTreeWidgetItem *>(itemToBeRemoved));
        int indexOfNextItem = par ? par->indexOfChild(nextItem) : tw->indexOfTopLevelItem(nextItem);

        if (indexOfItemToBeRemoved <= indexOfNextItem) {
            // A sibling to the left of us was deleted, adjust the m_currentIndex member of the iterator.
            // Note that the m_currentIndex will be wrong until the item is actually removed!
            m_currentIndex--;
        }
    }
}